

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelAnalyzer.cpp
# Opt level: O1

U32 __thiscall
SimpleParallelAnalyzer::GenerateSimulationData
          (SimpleParallelAnalyzer *this,U64 minimum_sample_index,U32 device_sample_rate,
          SimulationChannelDescriptor **simulation_channels)

{
  U32 UVar1;
  
  if (this->mSimulationInitilized == false) {
    UVar1 = Analyzer::GetSimulationSampleRate();
    SimpleParallelSimulationDataGenerator::Initialize
              (&this->mSimulationDataGenerator,UVar1,
               (this->mSettings)._M_t.
               super___uniq_ptr_impl<SimpleParallelAnalyzerSettings,_std::default_delete<SimpleParallelAnalyzerSettings>_>
               ._M_t.
               super__Tuple_impl<0UL,_SimpleParallelAnalyzerSettings_*,_std::default_delete<SimpleParallelAnalyzerSettings>_>
               .super__Head_base<0UL,_SimpleParallelAnalyzerSettings_*,_false>._M_head_impl);
    this->mSimulationInitilized = true;
  }
  UVar1 = SimpleParallelSimulationDataGenerator::GenerateSimulationData
                    (&this->mSimulationDataGenerator,minimum_sample_index,device_sample_rate,
                     simulation_channels);
  return UVar1;
}

Assistant:

U32 SimpleParallelAnalyzer::GenerateSimulationData( U64 minimum_sample_index, U32 device_sample_rate,
                                                    SimulationChannelDescriptor** simulation_channels )
{
    if( mSimulationInitilized == false )
    {
        mSimulationDataGenerator.Initialize( GetSimulationSampleRate(), mSettings.get() );
        mSimulationInitilized = true;
    }

    return mSimulationDataGenerator.GenerateSimulationData( minimum_sample_index, device_sample_rate, simulation_channels );
}